

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O3

int memory_write_free(archive *a,void *client_data)

{
  write_memory_data *mine;
  
  if (client_data != (void *)0x0) {
    free(client_data);
  }
  return 0;
}

Assistant:

static int
memory_write_free(struct archive *a, void *client_data)
{
	struct write_memory_data *mine;
	(void)a; /* UNUSED */
	mine = client_data;
	if (mine == NULL)
		return (ARCHIVE_OK);
	free(mine);
	return (ARCHIVE_OK);
}